

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.c
# Opt level: O3

HT_Boolean ht_bag_init(HT_Bag *bag,size_t min_capacity)

{
  void **ppvVar1;
  
  ppvVar1 = (void **)ht_alloc(min_capacity * 8);
  bag->data = ppvVar1;
  if (ppvVar1 != (void **)0x0) {
    bag->min_capacity = min_capacity;
    bag->capacity = min_capacity;
    bag->size = 0;
  }
  return (uint)(ppvVar1 != (void **)0x0);
}

Assistant:

HT_Boolean
ht_bag_init(HT_Bag* bag, size_t min_capacity)
{
    bag->data = ht_alloc(min_capacity * sizeof(void*));

    if (bag->data == NULL)
    {
        return HT_FALSE;
    }

    bag->min_capacity = min_capacity;
    bag->capacity = min_capacity;
    bag->size = 0;

    return HT_TRUE;
}